

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_hood.h
# Opt level: O2

pair<robin_hood::detail::Table<true,_80UL,_Rml::Element_*,_itlib::flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>_>_>_>_>,_robin_hood::hash<Rml::Element_*,_void>,_std::equal_to<Rml::Element_*>_>::Iter<false>,_bool>
* __thiscall
robin_hood::detail::
Table<true,80ul,Rml::Element*,itlib::flat_map<std::__cxx11::string,std::vector<Rml::DataAddressEntry,std::allocator<Rml::DataAddressEntry>>,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,std::vector<Rml::DataAddressEntry,std::allocator<Rml::DataAddressEntry>>>,std::allocator<std::pair<std::__cxx11::string,std::vector<Rml::DataAddressEntry,std::allocator<Rml::DataAddressEntry>>>>>>,robin_hood::hash<Rml::Element*,void>,std::equal_to<Rml::Element*>>
::
emplace<Rml::Element*&,itlib::flat_map<std::__cxx11::string,std::vector<Rml::DataAddressEntry,std::allocator<Rml::DataAddressEntry>>,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,std::vector<Rml::DataAddressEntry,std::allocator<Rml::DataAddressEntry>>>,std::allocator<std::pair<std::__cxx11::string,std::vector<Rml::DataAddressEntry,std::allocator<Rml::DataAddressEntry>>>>>>>
          (pair<robin_hood::detail::Table<true,_80UL,_Rml::Element_*,_itlib::flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>_>_>_>_>,_robin_hood::hash<Rml::Element_*,_void>,_std::equal_to<Rml::Element_*>_>::Iter<false>,_bool>
           *__return_storage_ptr__,
          Table<true,80ul,Rml::Element*,itlib::flat_map<std::__cxx11::string,std::vector<Rml::DataAddressEntry,std::allocator<Rml::DataAddressEntry>>,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,std::vector<Rml::DataAddressEntry,std::allocator<Rml::DataAddressEntry>>>,std::allocator<std::pair<std::__cxx11::string,std::vector<Rml::DataAddressEntry,std::allocator<Rml::DataAddressEntry>>>>>>,robin_hood::hash<Rml::Element*,void>,std::equal_to<Rml::Element*>>
          *this,Element **args,
          flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>_>_>_>_>
          *args_1)

{
  DataNode<robin_hood::detail::Table<true,_80UL,_Rml::Element_*,_itlib::flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>_>_>_>_>,_robin_hood::hash<Rml::Element_*,_void>,_std::equal_to<Rml::Element_*>_>,_true>
  local_30;
  
  local_30.mData.first = *args;
  local_30.mData.second.m_container.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (args_1->m_container).
       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_30.mData.second.m_container.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (args_1->m_container).
       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_30.mData.second.m_container.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (args_1->m_container).
       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (args_1->m_container).
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (args_1->m_container).
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (args_1->m_container).
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  doInsert<robin_hood::detail::Table<true,80ul,Rml::Element*,itlib::flat_map<std::__cxx11::string,std::vector<Rml::DataAddressEntry,std::allocator<Rml::DataAddressEntry>>,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,std::vector<Rml::DataAddressEntry,std::allocator<Rml::DataAddressEntry>>>,std::allocator<std::pair<std::__cxx11::string,std::vector<Rml::DataAddressEntry,std::allocator<Rml::DataAddressEntry>>>>>>,robin_hood::hash<Rml::Element*,void>,std::equal_to<Rml::Element*>>::DataNode<robin_hood::detail::Table<true,80ul,Rml::Element*,itlib::flat_map<std::__cxx11::string,std::vector<Rml::DataAddressEntry,std::allocator<Rml::DataAddressEntry>>,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,std::vector<Rml::DataAddressEntry,std::allocator<Rml::DataAddressEntry>>>,std::allocator<std::pair<std::__cxx11::string,std::vector<Rml::DataAddressEntry,std::allocator<Rml::DataAddressEntry>>>>>>,robin_hood::hash<Rml::Element*,void>,std::equal_to<Rml::Element*>>,true>>
            (__return_storage_ptr__,this,&local_30);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>_>_>_>
  ::~vector(&local_30.mData.second.m_container);
  return __return_storage_ptr__;
}

Assistant:

std::pair<iterator, bool> emplace(Args&&... args) {
        ROBIN_HOOD_TRACE(this)
        Node n{*this, std::forward<Args>(args)...};
        auto r = doInsert(std::move(n));
        if (!r.second) {
            // insertion not possible: destroy node
            // NOLINTNEXTLINE(bugprone-use-after-move)
            n.destroy(*this);
        }
        return r;
    }